

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O1

int do_copy(int nargs,char **args)

{
  int iVar1;
  int __fd;
  ssize_t sVar2;
  int iVar3;
  uint uVar4;
  void *__buf;
  void *__buf_00;
  uint uVar5;
  ulong uVar6;
  void *__ptr;
  stat info;
  stat local_c0;
  
  iVar3 = -1;
  if ((nargs == 3) && (iVar1 = stat(args[1],&local_c0), -1 < iVar1)) {
    __ptr = (void *)0x0;
    iVar1 = open(args[1],0);
    iVar3 = -1;
    if (iVar1 < 0) {
      __fd = -1;
    }
    else {
      __ptr = (void *)0x0;
      __fd = open(args[2],0x241,0x1b0);
      if (-1 < __fd) {
        __ptr = malloc(local_c0.st_size);
        if (__ptr == (void *)0x0) {
          __ptr = (void *)0x0;
        }
        else {
          if ((int)local_c0.st_size != 0) {
            uVar6 = local_c0.st_size & 0xffffffff;
            __buf = __ptr;
            do {
              sVar2 = read(iVar1,__buf,(long)(int)uVar6);
              uVar5 = (uint)sVar2;
              if ((int)uVar5 < 0) goto LAB_00105071;
              __buf_00 = __ptr;
              if (uVar5 == 0) break;
              __buf = (void *)((long)__buf + (ulong)(uVar5 & 0x7fffffff));
              uVar5 = (int)uVar6 - uVar5;
              uVar6 = (ulong)uVar5;
            } while (uVar5 != 0);
            do {
              sVar2 = write(__fd,__buf_00,(long)(int)local_c0.st_size);
              uVar5 = (uint)sVar2;
              if ((int)uVar5 < 0) goto LAB_00105071;
              if (uVar5 == 0) break;
              uVar4 = (int)local_c0.st_size - uVar5;
              local_c0.st_size = (__off_t)uVar4;
              __buf_00 = (void *)((long)__buf_00 + (ulong)(uVar5 & 0x7fffffff));
            } while (uVar4 != 0);
          }
          iVar3 = 0;
        }
      }
    }
LAB_00105071:
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (-1 < iVar1) {
      close(iVar1);
    }
    if (-1 < __fd) {
      close(__fd);
    }
  }
  return iVar3;
}

Assistant:

int do_copy(int nargs, char **args)
{
    char *buffer = NULL;
    int rc = 0;
    int fd1 = -1, fd2 = -1;
    struct stat info;
    int brtw, brtr;
    char *p;

    if (nargs != 3)
        return -1;

    if (stat(args[1], &info) < 0) 
        return -1;

    if ((fd1 = open(args[1], O_RDONLY)) < 0) 
        goto out_err;

    if ((fd2 = open(args[2], O_WRONLY|O_CREAT|O_TRUNC, 0660)) < 0)
        goto out_err;

    if (!(buffer = malloc(info.st_size)))
        goto out_err;

    p = buffer;
    brtr = info.st_size;
    while(brtr) {
        rc = read(fd1, p, brtr);
        if (rc < 0)
            goto out_err;
        if (rc == 0)
            break;
        p += rc;
        brtr -= rc;
    }

    p = buffer;
    brtw = info.st_size;
    while(brtw) {
        rc = write(fd2, p, brtw);
        if (rc < 0)
            goto out_err;
        if (rc == 0)
            break;
        p += rc;
        brtw -= rc;
    }

    rc = 0;
    goto out;
out_err:
    rc = -1;
out:
    if (buffer)
        free(buffer);
    if (fd1 >= 0)
        close(fd1);
    if (fd2 >= 0)
        close(fd2);
    return rc;
}